

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_issuer_source_sync_unittest.h
# Opt level: O1

bool __thiscall
bssl::CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>::
IssuersMatch(CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
             *this,shared_ptr<const_bssl::ParsedCertificate> *cert,
            ParsedCertificateList *expected_matches)

{
  element_type *peVar1;
  long lVar2;
  pointer pIVar3;
  pointer pIVar4;
  bool bVar5;
  ulong uVar6;
  char *message;
  shared_ptr<const_bssl::ParsedCertificate> *it;
  pointer psVar7;
  shared_ptr<const_bssl::ParsedCertificate> *it_1;
  pointer psVar8;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> der_expected_matches;
  AssertionResult gtest_ar;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> der_result_matches;
  ParsedCertificateList matches;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_a8;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->delegate_).source_.super_CertIssuerSource._vptr_CertIssuerSource[2])
            (&this->delegate_,
             (cert->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  psVar8 = local_48.
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start = (Input *)0x0;
  local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish = (Input *)0x0;
  local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Input *)0x0;
  if (local_48.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar7 = local_48.
             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar1 = (psVar7->
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(peVar1->cert_).data_.data_;
      local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(peVar1->cert_).data_.size_;
      if (local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::
        _M_realloc_insert<bssl::der::Input>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Input *)&local_a8);
      }
      else {
        ((local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish)->data_).data_ =
             (uchar *)local_a8.
                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        ((local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish)->data_).size_ =
             (size_t)local_a8.
                     super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
                     .super__Vector_impl_data._M_finish;
        local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar8);
  }
  pIVar4 = local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pIVar3 = local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pIVar3,pIVar4);
  }
  local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start = (Input *)0x0;
  local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish = (Input *)0x0;
  local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Input *)0x0;
  psVar8 = (expected_matches->
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (expected_matches->
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar7) {
    do {
      peVar1 = (psVar8->
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_88 = (undefined1  [8])(peVar1->cert_).data_.data_;
      pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (peVar1->cert_).data_.size_;
      if (local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::
        _M_realloc_insert<bssl::der::Input>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Input *)local_88);
      }
      else {
        ((local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish)->data_).data_ = (uchar *)local_88;
        ((local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish)->data_).size_ = (size_t)pbStack_80;
        local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar7);
  }
  pIVar4 = local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pIVar3 = local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pIVar3,pIVar4);
  }
  if ((long)local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_start ==
      (long)local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_start) {
    bVar5 = ::std::__equal<false>::equal<bssl::der::Input_const*,bssl::der::Input_const*>
                      (local_a8.
                       super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_a8.
                       super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       local_78.
                       super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar5 = false;
  }
  if (bVar5 == false) {
    testing::internal::
    CmpHelperEQ<std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>
              ((internal *)local_88,"der_expected_matches","der_result_matches",&local_a8,&local_78)
    ;
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/cert_issuer_source_sync_unittest.h"
                 ,0x7d,message);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  if (local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start != (Input *)0x0) {
    operator_delete(local_a8.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start != (Input *)0x0) {
    operator_delete(local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector(&local_48);
  return bVar5;
}

Assistant:

bool IssuersMatch(std::shared_ptr<const ParsedCertificate> cert,
                    ParsedCertificateList expected_matches) {
    ParsedCertificateList matches;
    source().SyncGetIssuersOf(cert.get(), &matches);

    std::vector<der::Input> der_result_matches;
    for (const auto &it : matches) {
      der_result_matches.push_back(it->der_cert());
    }
    std::sort(der_result_matches.begin(), der_result_matches.end());

    std::vector<der::Input> der_expected_matches;
    for (const auto &it : expected_matches) {
      der_expected_matches.push_back(it->der_cert());
    }
    std::sort(der_expected_matches.begin(), der_expected_matches.end());

    if (der_expected_matches == der_result_matches) {
      return true;
    }

    // Print some extra information for debugging.
    EXPECT_EQ(der_expected_matches, der_result_matches);
    return false;
  }